

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider.hpp
# Opt level: O0

NetworkProto netifaces::NetworkInterfaceProvider::internal::convertToProto(sa_family_t family)

{
  undefined4 local_c;
  sa_family_t family_local;
  
  if (family == 2) {
    local_c = IPv4;
  }
  else if (family == 10) {
    local_c = IPv6;
  }
  else if (family == 0x11) {
    local_c = ETHERNET;
  }
  else {
    local_c = UNKNOWN;
  }
  return local_c;
}

Assistant:

inline NetworkProto convertToProto(sa_family_t family) {
                switch(family) {
                    case AF_INET:
                        return NetworkProto::IPv4;
                    case AF_INET6:
                        return NetworkProto::IPv6;
#ifdef __APPLE__
                    case AF_LINK:
                        return NetworkProto::ETHERNET;
#endif
#ifdef __linux__
                    case AF_PACKET:
                        return NetworkProto::ETHERNET;
#endif
                    default:
                        return NetworkProto::UNKNOWN;
                }
            }